

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O0

Abc_Ntk_t * Mop_ManTest(char *pFileName,int fMerge,int fVerbose)

{
  Mop_Man_t *p_00;
  Mop_Man_t *p;
  Abc_Ntk_t *pNtk;
  int fVerbose_local;
  int fMerge_local;
  char *pFileName_local;
  
  p_00 = Mop_ManRead(pFileName);
  if (p_00 == (Mop_Man_t *)0x0) {
    pFileName_local = (char *)0x0;
  }
  else {
    Mop_ManRemoveEmpty(p_00);
    if (fMerge == 0) {
      Mop_ManReduce(p_00);
    }
    else {
      Mop_ManReduce2(p_00);
    }
    pFileName_local = (char *)Mop_ManDerive(p_00,pFileName);
    Mop_ManStop(p_00);
  }
  return (Abc_Ntk_t *)pFileName_local;
}

Assistant:

Abc_Ntk_t * Mop_ManTest( char * pFileName, int fMerge, int fVerbose )
{
    Abc_Ntk_t * pNtk = NULL;
    Mop_Man_t * p = Mop_ManRead( pFileName );
    if ( p == NULL )
        return NULL;
    Mop_ManRemoveEmpty( p );
    //Mop_ManPrint( p );
    if ( fMerge )
        Mop_ManReduce2( p );
    else
        Mop_ManReduce( p );
    //Mop_ManPrint( p );
    pNtk = Mop_ManDerive( p, pFileName );
    Mop_ManStop( p );
    return pNtk;
}